

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O2

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuItemKeys> *list)

{
  char cVar1;
  long in_FS_OFFSET;
  undefined1 *local_50;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuItemKeys>::clear(list);
  while( true ) {
    cVar1 = QDBusArgument::atEnd();
    if (cVar1 != '\0') break;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_48.size = 0;
    operator>>(arg,(QDBusMenuItemKeys *)&local_50);
    QList<QDBusMenuItemKeys>::emplaceBack<QDBusMenuItemKeys_const&>
              (list,(QDBusMenuItemKeys *)&local_50);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}